

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_edge_offset_class1_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  UWORD8 *pUVar7;
  WORD8 *pWVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  byte local_f8 [120];
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [64];
  
  lVar9 = (long)wd;
  local_f8[0] = 0xff;
  local_f8[1] = 0xff;
  local_f8[2] = 0xff;
  local_f8[3] = 0xff;
  local_f8[4] = 0xff;
  local_f8[5] = 0xff;
  local_f8[6] = 0xff;
  local_f8[7] = 0xff;
  local_f8[8] = 0xff;
  local_f8[9] = 0xff;
  local_f8[10] = 0xff;
  local_f8[0xb] = 0xff;
  local_f8[0xc] = 0xff;
  local_f8[0xd] = 0xff;
  local_f8[0xe] = 0xff;
  local_f8[0xf] = 0xff;
  local_f8[0x10] = 0xff;
  local_f8[0x11] = 0xff;
  local_f8[0x12] = 0xff;
  local_f8[0x13] = 0xff;
  local_f8[0x14] = 0xff;
  local_f8[0x15] = 0xff;
  local_f8[0x16] = 0xff;
  local_f8[0x17] = 0xff;
  local_f8[0x18] = 0xff;
  local_f8[0x19] = 0xff;
  local_f8[0x1a] = 0xff;
  local_f8[0x1b] = 0xff;
  local_f8[0x1c] = 0xff;
  local_f8[0x1d] = 0xff;
  local_f8[0x1e] = 0xff;
  local_f8[0x1f] = 0xff;
  local_f8[0x20] = 0xff;
  local_f8[0x21] = 0xff;
  local_f8[0x22] = 0xff;
  local_f8[0x23] = 0xff;
  local_f8[0x24] = 0xff;
  local_f8[0x25] = 0xff;
  local_f8[0x26] = 0xff;
  local_f8[0x27] = 0xff;
  local_f8[0x28] = 0xff;
  local_f8[0x29] = 0xff;
  local_f8[0x2a] = 0xff;
  local_f8[0x2b] = 0xff;
  local_f8[0x2c] = 0xff;
  local_f8[0x2d] = 0xff;
  local_f8[0x2e] = 0xff;
  local_f8[0x2f] = 0xff;
  local_f8[0x30] = 0xff;
  local_f8[0x31] = 0xff;
  local_f8[0x32] = 0xff;
  local_f8[0x33] = 0xff;
  local_f8[0x34] = 0xff;
  local_f8[0x35] = 0xff;
  local_f8[0x36] = 0xff;
  local_f8[0x37] = 0xff;
  local_f8[0x38] = 0xff;
  local_f8[0x39] = 0xff;
  local_f8[0x3a] = 0xff;
  local_f8[0x3b] = 0xff;
  local_f8[0x3c] = 0xff;
  local_f8[0x3d] = 0xff;
  local_f8[0x3e] = 0xff;
  local_f8[0x3f] = 0xff;
  *pu1_src_top_left = pu1_src_top[lVar9 + -2];
  pu1_src_top_left[1] = pu1_src_top[lVar9 + -1];
  uVar2 = 0;
  uVar10 = 0;
  if (0 < ht) {
    uVar10 = (ulong)(uint)ht;
  }
  pUVar7 = pu1_src + lVar9 + -1;
  for (; uVar10 != uVar2; uVar2 = uVar2 + 1) {
    pu1_src_left[uVar2 * 2] = pUVar7[-1];
    pu1_src_left[uVar2 * 2 + 1] = *pUVar7;
    pUVar7 = pUVar7 + src_strd;
  }
  iVar4 = ht + -1;
  uVar10 = 0;
  uVar2 = 0;
  if (0 < wd) {
    uVar2 = (ulong)(uint)wd;
  }
  for (; uVar2 != uVar10; uVar10 = uVar10 + 1) {
    au1_mask[uVar10 + 8] = pu1_src[uVar10 + (long)(src_strd * iVar4)];
  }
  if (pu1_avail[2] == '\0') {
    pUVar7 = pu1_src + src_strd;
    for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
      bVar11 = pUVar7[uVar10] != pu1_src[uVar10];
      if (pUVar7[uVar10] < pu1_src[uVar10]) {
        bVar11 = 0xff;
      }
      local_f8[uVar10 + 0x40] = bVar11;
    }
  }
  else {
    for (uVar10 = 0; pUVar7 = pu1_src, iVar4 = ht, uVar2 != uVar10; uVar10 = uVar10 + 1) {
      bVar11 = pu1_src[uVar10] != pu1_src_top[uVar10];
      if (pu1_src[uVar10] < pu1_src_top[uVar10]) {
        bVar11 = 0xff;
      }
      local_f8[uVar10 + 0x40] = bVar11;
    }
  }
  iVar4 = iVar4 - (uint)(pu1_avail[3] == '\0');
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar3 != iVar4; iVar3 = iVar3 + 1) {
    for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
      bVar11 = pUVar7[uVar10];
      bVar1 = (pUVar7 + src_strd)[uVar10];
      uVar5 = (uint)(bVar11 != bVar1);
      if (bVar11 < bVar1) {
        uVar5 = 0xffffffff;
      }
      bVar1 = local_f8[uVar10 + 0x40];
      local_f8[uVar10 + 0x40] = -(char)uVar5;
      if (((uint)local_f8[uVar10 >> 1 & 0x7fffffff] &
          gi4_ihevc_table_edge_idx[(long)(char)bVar1 + (long)(int)uVar5 + 2]) != 0) {
        pWVar8 = pi1_sao_offset_v;
        if ((uVar10 & 1) == 0) {
          pWVar8 = pi1_sao_offset_u;
        }
        iVar6 = (int)pWVar8[(uint)local_f8[uVar10 >> 1 & 0x7fffffff] &
                            gi4_ihevc_table_edge_idx[(long)(char)bVar1 + (long)(int)uVar5 + 2]] +
                (uint)bVar11;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        pUVar7[uVar10] = (UWORD8)iVar6;
      }
    }
    pUVar7 = pUVar7 + src_strd;
  }
  for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
    pu1_src_top[uVar10] = au1_mask[uVar10 + 8];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class1_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    WORD8 u1_sign_down;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_CHROMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[2 * row] = pu1_src[row * src_strd + wd - 2];
        pu1_src_left[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update height and source pointers based on the availability flags */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col]);
        }
    }
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + src_strd]);
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                au1_sign_up[col] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}